

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::RecursiveStructMemberIterator::RecursiveStructMemberIterator
          (RecursiveStructMemberIterator *this,ConstantValue *startVal,Type *startType)

{
  Type *pTVar1;
  SyntaxNode *pSVar2;
  
  (this->curr).val = (ConstantValue *)0x0;
  (this->curr).type = (Type *)0x0;
  (this->curr).valIndex = 0;
  (this->curr).fieldIt._M_current = (FieldSymbol **)0x0;
  (this->curr).fieldEnd._M_current = (FieldSymbol **)0x0;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.data_ =
       (pointer)(this->stack).
                super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.firstElement
  ;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.len = 0;
  (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.cap = 4;
  (this->curr).val = startVal;
  (this->curr).type = startType;
  if (startType->canonical == (Type *)0x0) {
    Type::resolveCanonical(startType);
  }
  if ((startType->canonical->super_Symbol).kind == UnpackedStructType) {
    pTVar1 = (this->curr).type;
    if (pTVar1->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
    }
    pSVar2 = pTVar1->canonical[1].super_Symbol.originatingSyntax;
    pTVar1 = pTVar1->canonical[1].canonical;
    (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar2;
    (this->curr).fieldEnd._M_current = (FieldSymbol **)(&pSVar2->kind + (long)pTVar1 * 2);
    prepNext(this);
  }
  return;
}

Assistant:

RecursiveStructMemberIterator(const ConstantValue& startVal, const Type& startType) {
        curr.val = &startVal;
        curr.type = &startType;

        if (curr.type->isUnpackedStruct()) {
            auto fields = curr.type->getCanonicalType().as<UnpackedStructType>().fields;
            curr.fieldIt = fields.begin();
            curr.fieldEnd = fields.end();
            prepNext();
        }
    }